

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O0

int __thiscall doctest::Context::run(Context *this)

{
  ContextState *pCVar1;
  value_type pTVar2;
  char *file;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ContextState **ppCVar7;
  set<doctest::detail::TestData,_std::less<doctest::detail::TestData>,_std::allocator<doctest::detail::TestData>_>
  *this_00;
  size_type sVar8;
  reference ppTVar9;
  reference pvVar10;
  size_type sVar11;
  TestAccessibleContextState *pTVar12;
  char *pcVar13;
  Color local_597;
  Color local_596;
  Color local_595;
  Color local_594;
  Color local_593;
  Color local_592;
  Color local_591;
  Color local_590;
  Color col_19;
  Color col_18;
  Color col_17;
  Color col_16;
  Color col_15;
  Color col_14;
  Color col_13;
  Color col_12;
  Color col_11;
  Color col_10;
  Color col_9;
  Color col_8;
  Color col_7;
  Color col_6;
  Color col_5;
  char buff [1024];
  Color col_4;
  Color col_3;
  uint didFail;
  String local_170;
  String local_168;
  vector<doctest::String,_std::allocator<doctest::String>_> local_160;
  vector<doctest::String,_std::allocator<doctest::String>_> local_148;
  vector<doctest::String,_std::allocator<doctest::String>_> local_130;
  vector<doctest::String,_std::allocator<doctest::String>_> local_118;
  vector<doctest::String,_std::allocator<doctest::String>_> local_100;
  vector<doctest::String,_std::allocator<doctest::String>_> local_e8;
  value_type local_d0;
  TestData *data;
  uint local_c0;
  uint numFailed;
  uint numTestsPassingFilters;
  Color col_2;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilters;
  Color col_1;
  TestData *temp;
  int idxToSwap;
  TestData **first;
  _Self local_60;
  _Self local_58;
  iterator it;
  vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
  testArray;
  set<doctest::detail::TestData,_std::less<doctest::detail::TestData>,_std::allocator<doctest::detail::TestData>_>
  *registeredTests;
  uint i;
  Color local_19;
  Context *pCStack_18;
  Color col;
  Context *this_local;
  
  pCVar1 = this->p;
  pCStack_18 = this;
  ppCVar7 = detail::getContextState();
  *ppCVar7 = pCVar1;
  detail::ContextState::resetRunData(this->p);
  if ((((this->p->no_run & 1U) == 0) && ((this->p->version & 1U) == 0)) &&
     ((this->p->help & 1U) == 0)) {
    detail::printVersion();
    do {
      detail::Color::Color(&local_19,Cyan);
      printf("%s","[doctest] ");
      detail::Color::~Color(&local_19);
      bVar4 = detail::always_false();
    } while (bVar4);
    printf("run with \"--help\" for options\n");
    this_00 = detail::getRegisteredTests();
    std::
    vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>::
    vector((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
            *)&it);
    local_58._M_node =
         (_Base_ptr)
         std::
         set<doctest::detail::TestData,_std::less<doctest::detail::TestData>,_std::allocator<doctest::detail::TestData>_>
         ::begin(this_00);
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           std::
           set<doctest::detail::TestData,_std::less<doctest::detail::TestData>,_std::allocator<doctest::detail::TestData>_>
           ::end(this_00);
      bVar4 = std::operator!=(&local_58,&local_60);
      if (!bVar4) break;
      first = (TestData **)
              std::_Rb_tree_const_iterator<doctest::detail::TestData>::operator*(&local_58);
      std::
      vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
      ::push_back((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                   *)&it,(value_type *)&first);
      std::_Rb_tree_const_iterator<doctest::detail::TestData>::operator++(&local_58);
    }
    sVar8 = std::
            vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
            ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                    *)&it);
    if (sVar8 != 0) {
      iVar5 = String::compare(&this->p->order_by,"file",true);
      if (iVar5 == 0) {
        ppTVar9 = std::
                  vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                  ::operator[]((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                *)&it,0);
        sVar8 = std::
                vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                        *)&it);
        qsort(ppTVar9,sVar8,8,detail::fileOrderComparator);
      }
      else {
        iVar5 = String::compare(&this->p->order_by,"suite",true);
        if (iVar5 == 0) {
          ppTVar9 = std::
                    vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                    ::operator[]((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                  *)&it,0);
          sVar8 = std::
                  vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                  ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                          *)&it);
          qsort(ppTVar9,sVar8,8,detail::suiteOrderComparator);
        }
        else {
          iVar5 = String::compare(&this->p->order_by,"name",true);
          if (iVar5 == 0) {
            ppTVar9 = std::
                      vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                      ::operator[]((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                    *)&it,0);
            sVar8 = std::
                    vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                    ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                            *)&it);
            qsort(ppTVar9,sVar8,8,detail::nameOrderComparator);
          }
          else {
            iVar5 = String::compare(&this->p->order_by,"rand",true);
            if (iVar5 == 0) {
              srand(this->p->rand_seed);
              ppTVar9 = std::
                        vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                        ::operator[]((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                                      *)&it,0);
              sVar8 = std::
                      vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                      ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                              *)&it);
              uVar3 = (uint)sVar8;
              while (registeredTests._0_4_ = uVar3 - 1, (uint)registeredTests != 0) {
                uVar6 = rand();
                pTVar2 = ppTVar9[(uint)registeredTests];
                ppTVar9[(uint)registeredTests] = ppTVar9[(int)(uVar6 % uVar3)];
                ppTVar9[(int)(uVar6 % uVar3)] = pTVar2;
                uVar3 = (uint)registeredTests;
              }
            }
          }
        }
      }
    }
    if ((this->p->list_test_cases & 1U) != 0) {
      do {
        detail::Color::Color
                  ((Color *)((long)&testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count + 7),Cyan);
        printf("%s");
        detail::Color::~Color
                  ((Color *)((long)&testSuitesPassingFilters._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count + 7));
        bVar4 = detail::always_false();
      } while (bVar4);
      printf("listing all test case names\n");
    }
    std::set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::set
              ((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_> *
               )&numTestsPassingFilters);
    if ((this->p->list_test_suites & 1U) != 0) {
      do {
        detail::Color::Color((Color *)((long)&numFailed + 3),Cyan);
        printf("%s");
        detail::Color::~Color((Color *)((long)&numFailed + 3));
        bVar4 = detail::always_false();
      } while (bVar4);
      printf("listing all test suites\n");
    }
    local_c0 = 0;
    data._4_4_ = 0;
    for (registeredTests._0_4_ = 0;
        sVar8 = std::
                vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                        *)&it), (uint)registeredTests < sVar8;
        registeredTests._0_4_ = (uint)registeredTests + 1) {
      ppTVar9 = std::
                vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                ::operator[]((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                              *)&it,(ulong)(uint)registeredTests);
      local_d0 = *ppTVar9;
      pcVar13 = local_d0->m_file;
      pvVar10 = std::
                vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                ::operator[](&this->p->filters,0);
      std::vector<doctest::String,_std::allocator<doctest::String>_>::vector(&local_e8,pvVar10);
      iVar5 = detail::matchesAny(pcVar13,&local_e8,1,(bool)(this->p->case_sensitive & 1));
      std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_e8);
      if (iVar5 != 0) {
        pcVar13 = local_d0->m_file;
        pvVar10 = std::
                  vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                  ::operator[](&this->p->filters,1);
        std::vector<doctest::String,_std::allocator<doctest::String>_>::vector(&local_100,pvVar10);
        iVar5 = detail::matchesAny(pcVar13,&local_100,0,(bool)(this->p->case_sensitive & 1));
        std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_100);
        if (iVar5 == 0) {
          pcVar13 = local_d0->m_suite;
          pvVar10 = std::
                    vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                    ::operator[](&this->p->filters,2);
          std::vector<doctest::String,_std::allocator<doctest::String>_>::vector(&local_118,pvVar10)
          ;
          iVar5 = detail::matchesAny(pcVar13,&local_118,1,(bool)(this->p->case_sensitive & 1));
          std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_118);
          if (iVar5 != 0) {
            pcVar13 = local_d0->m_suite;
            pvVar10 = std::
                      vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                      ::operator[](&this->p->filters,3);
            std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                      (&local_130,pvVar10);
            iVar5 = detail::matchesAny(pcVar13,&local_130,0,(bool)(this->p->case_sensitive & 1));
            std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_130);
            if (iVar5 == 0) {
              pcVar13 = local_d0->m_name;
              pvVar10 = std::
                        vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                        ::operator[](&this->p->filters,4);
              std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                        (&local_148,pvVar10);
              iVar5 = detail::matchesAny(pcVar13,&local_148,1,(bool)(this->p->case_sensitive & 1));
              std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_148);
              if (iVar5 != 0) {
                pcVar13 = local_d0->m_name;
                pvVar10 = std::
                          vector<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                          ::operator[](&this->p->filters,5);
                std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
                          (&local_160,pvVar10);
                iVar5 = detail::matchesAny(pcVar13,&local_160,0,(bool)(this->p->case_sensitive & 1))
                ;
                std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_160);
                if ((iVar5 == 0) && (local_c0 = local_c0 + 1, (this->p->count & 1U) == 0)) {
                  if ((this->p->list_test_cases & 1U) == 0) {
                    if ((this->p->list_test_suites & 1U) == 0) {
                      if (((local_c0 <= this->p->last) || (this->p->last < this->p->first)) &&
                         (this->p->first <= local_c0)) {
                        (this->p->super_TestAccessibleContextState).currentTest = local_d0;
                        (this->p->super_TestAccessibleContextState).hasLoggedCurrentTestStart =
                             false;
                        if (((this->p->super_TestAccessibleContextState).success & 1U) != 0) {
                          do {
                            pTVar12 = detail::getTestsContextState();
                            if ((pTVar12->hasLoggedCurrentTestStart & 1U) == 0) {
                              pTVar12 = detail::getTestsContextState();
                              pcVar13 = pTVar12->currentTest->m_name;
                              pTVar12 = detail::getTestsContextState();
                              file = pTVar12->currentTest->m_file;
                              pTVar12 = detail::getTestsContextState();
                              detail::logTestStart(pcVar13,file,pTVar12->currentTest->m_line);
                              pTVar12 = detail::getTestsContextState();
                              pTVar12->hasLoggedCurrentTestStart = true;
                            }
                            bVar4 = detail::always_false();
                          } while (bVar4);
                        }
                        buff[0x3fc] = '\0';
                        buff[0x3fd] = '\0';
                        buff[0x3fe] = '\0';
                        buff[0x3ff] = '\0';
                        std::
                        set<doctest::detail::SubcaseSignature,_std::less<doctest::detail::SubcaseSignature>,_std::allocator<doctest::detail::SubcaseSignature>_>
                        ::clear(&this->p->subcasesPassed);
                        do {
                          (this->p->super_TestAccessibleContextState).
                          numAssertionsForCurrentTestcase = 0;
                          this->p->numFailedAssertionsForCurrentTestcase = 0;
                          this->p->subcasesHasSkipped = false;
                          this->p->subcasesCurrentLevel = 0;
                          std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                                    (&this->p->subcasesEnteredLevels);
                          iVar5 = detail::callTestFunc(local_d0->m_f);
                          buff._1020_4_ = iVar5 + buff._1020_4_;
                          this->p->numAssertions =
                               (this->p->super_TestAccessibleContextState).
                               numAssertionsForCurrentTestcase + this->p->numAssertions;
                          if ((0 < this->p->abort_after) &&
                             (this->p->abort_after <= this->p->numFailedAssertions)) {
                            this->p->subcasesHasSkipped = false;
                          }
                          if (((this->p->super_TestAccessibleContextState).hasLoggedCurrentTestStart
                              & 1U) != 0) {
                            detail::logTestEnd();
                          }
                          (this->p->super_TestAccessibleContextState).hasLoggedCurrentTestStart =
                               false;
                        } while ((this->p->subcasesHasSkipped & 1U) == 1);
                        if (buff._1020_4_ != 0) {
                          data._4_4_ = data._4_4_ + 1;
                        }
                        if ((0 < this->p->abort_after) &&
                           (this->p->abort_after <= this->p->numFailedAssertions)) break;
                      }
                    }
                    else {
                      String::String(&local_168,local_d0->m_suite);
                      sVar11 = std::
                               set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                               ::count((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                                        *)&numTestsPassingFilters,&local_168);
                      String::~String(&local_168);
                      if (sVar11 == 0) {
                        printf("%s\n",local_d0->m_suite);
                        String::String(&local_170,local_d0->m_suite);
                        std::
                        set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                        ::insert((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                                  *)&numTestsPassingFilters,&local_170);
                        String::~String(&local_170);
                      }
                    }
                  }
                  else {
                    printf("%s\n");
                  }
                }
              }
            }
          }
        }
      }
    }
    do {
      pcVar13 = detail::getSeparator();
      if (*pcVar13 != '\0') {
        detail::Color::Color((Color *)(buff + 0x3fb),(data._4_4_ == 0) + Red);
        detail::getSeparator();
        printf("%s");
        detail::Color::~Color((Color *)(buff + 0x3fb));
      }
      bVar4 = detail::always_false();
    } while (bVar4);
    if ((((this->p->count & 1U) == 0) && ((this->p->list_test_cases & 1U) == 0)) &&
       ((this->p->list_test_suites & 1U) == 0)) {
      do {
        detail::Color::Color(&col_13,Cyan);
        printf("%s","[doctest] ");
        detail::Color::~Color(&col_13);
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400,"test cases: %4d",(ulong)local_c0);
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&col_14,None);
          printf("%s");
          detail::Color::~Color(&col_14);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400," | ");
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&col_15,None);
          printf("%s");
          detail::Color::~Color(&col_15);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400,"%4d passed",(ulong)(local_c0 - data._4_4_));
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&col_16,(uint)(data._4_4_ == 0) + (uint)(data._4_4_ == 0) * 2);
          printf("%s",&col_12);
          detail::Color::~Color(&col_16);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400," | ");
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&col_17,None);
          printf("%s");
          detail::Color::~Color(&col_17);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400,"%4d failed",(ulong)data._4_4_);
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&col_18,(uint)(data._4_4_ != 0) * 2);
          printf("%s",&col_12);
          detail::Color::~Color(&col_18);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400," | ");
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&col_19,None);
          printf("%s");
          detail::Color::~Color(&col_19);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      sVar8 = std::
              vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
              ::size((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
                      *)&it);
      snprintf((char *)&col_12,0x400,"%4d skipped\n",(ulong)((int)sVar8 - local_c0));
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_590,None);
          printf("%s");
          detail::Color::~Color(&local_590);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      do {
        detail::Color::Color(&local_591,Cyan);
        printf("%s","[doctest] ");
        detail::Color::~Color(&local_591);
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400,"assertions: %4d",(ulong)(uint)this->p->numAssertions);
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_592,None);
          printf("%s");
          detail::Color::~Color(&local_592);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400," | ");
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_593,None);
          printf("%s");
          detail::Color::~Color(&local_593);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400,"%4d passed",
               (ulong)(uint)(this->p->numAssertions - this->p->numFailedAssertions));
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_594,(uint)(data._4_4_ == 0) + (uint)(data._4_4_ == 0) * 2);
          printf("%s",&col_12);
          detail::Color::~Color(&local_594);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400," | ");
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_595,None);
          printf("%s");
          detail::Color::~Color(&local_595);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400,"%4d failed",(ulong)(uint)this->p->numFailedAssertions);
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_596,(uint)(0 < this->p->numFailedAssertions) * 2);
          printf("%s",&col_12);
          detail::Color::~Color(&local_596);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
      snprintf((char *)&col_12,0x400," |\n");
      do {
        if (col_12 != (Color)0x0) {
          detail::Color::Color(&local_597,None);
          printf("%s");
          detail::Color::~Color(&local_597);
        }
        bVar4 = detail::always_false();
      } while (bVar4);
    }
    else {
      do {
        detail::Color::Color((Color *)(buff + 0x3fa),Cyan);
        printf("%s","[doctest] ");
        detail::Color::~Color((Color *)(buff + 0x3fa));
        bVar4 = detail::always_false();
      } while (bVar4);
      printf("number of tests passing the current filters: %d\n",(ulong)local_c0);
    }
    do {
      bVar4 = detail::always_false();
    } while (bVar4);
    ppCVar7 = detail::getContextState();
    *ppCVar7 = (ContextState *)0x0;
    if ((data._4_4_ == 0) || ((this->p->no_exitcode & 1U) != 0)) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = 1;
    }
    std::set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>::~set
              ((set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_> *
               )&numTestsPassingFilters);
    std::
    vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>::
    ~vector((vector<const_doctest::detail::TestData_*,_std::allocator<const_doctest::detail::TestData_*>_>
             *)&it);
  }
  else {
    if ((this->p->version & 1U) != 0) {
      detail::printVersion();
    }
    if ((this->p->help & 1U) != 0) {
      detail::printHelp();
    }
    ppCVar7 = detail::getContextState();
    *ppCVar7 = (ContextState *)0x0;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Context::run() {
    using namespace detail;

    getContextState() = p;
    p->resetRunData();

    // handle version, help and no_run
    if(p->no_run || p->version || p->help) {
        if(p->version)
            printVersion();
        if(p->help)
            printHelp();

        getContextState() = 0;

        return EXIT_SUCCESS;
    }

    printVersion();
    DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
    printf("run with \"--help\" for options\n");

    unsigned i = 0; // counter used for loops - here for VC6

    std::set<TestData>& registeredTests = getRegisteredTests();

    std::vector<const TestData*> testArray;
    for(std::set<TestData>::iterator it = registeredTests.begin(); it != registeredTests.end();
        ++it)
        testArray.push_back(&(*it));

    // sort the collected records
    if(testArray.size() > 0) {
        if(p->order_by.compare("file", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            qsort(&testArray[0], testArray.size(), sizeof(TestData*), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            srand(p->rand_seed);

            // random_shuffle implementation
            const TestData** first = &testArray[0];
            for(i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = rand() % (i + 1);

                const TestData* temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        }
    }

    if(p->list_test_cases) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test case names\n");
    }

    std::set<String> testSuitesPassingFilters;
    if(p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("listing all test suites\n");
    }

    unsigned numTestsPassingFilters = 0;
    unsigned numFailed              = 0;
    // invoke the registered functions if they match the filter criteria (or just count them)
    for(i = 0; i < testArray.size(); i++) {
        const TestData& data = *testArray[i];
        if(!matchesAny(data.m_file, p->filters[0], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_file, p->filters[1], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_suite, p->filters[2], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_suite, p->filters[3], 0, p->case_sensitive))
            continue;
        if(!matchesAny(data.m_name, p->filters[4], 1, p->case_sensitive))
            continue;
        if(matchesAny(data.m_name, p->filters[5], 0, p->case_sensitive))
            continue;

        numTestsPassingFilters++;

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            printf("%s\n", data.m_name);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if(testSuitesPassingFilters.count(data.m_suite) == 0) {
                printf("%s\n", data.m_suite);
                testSuitesPassingFilters.insert(data.m_suite);
            }
            continue;
        }

        // skip the test if it is not in the execution range
        if((p->last < numTestsPassingFilters && p->first <= p->last) ||
           (p->first > numTestsPassingFilters))
            continue;

        // execute the test if it passes all the filtering
        {
#ifdef _MSC_VER
//__try {
#endif // _MSC_VER

            p->currentTest = &data;

            // if logging successful tests - force the start log
            p->hasLoggedCurrentTestStart = false;
            if(p->success)
                DOCTEST_LOG_START();

            unsigned didFail = 0;
            p->subcasesPassed.clear();
            do {
                // reset the assertion state
                p->numAssertionsForCurrentTestcase       = 0;
                p->numFailedAssertionsForCurrentTestcase = 0;

                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->subcasesHasSkipped   = false;
                p->subcasesCurrentLevel = 0;
                p->subcasesEnteredLevels.clear();

                // execute the test
                didFail += callTestFunc(data.m_f);
                p->numAssertions += p->numAssertionsForCurrentTestcase;

                // exit this loop if enough assertions have failed
                if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                    p->subcasesHasSkipped = false;

                // if the start has been logged
                if(p->hasLoggedCurrentTestStart)
                    logTestEnd();
                p->hasLoggedCurrentTestStart = false;

            } while(p->subcasesHasSkipped == true);

            if(didFail > 0)
                numFailed++;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numFailedAssertions >= p->abort_after)
                break;

#ifdef _MSC_VER
//} __except(1) {
//    printf("Unknown SEH exception caught!\n");
//    numFailed++;
//}
#endif // _MSC_VER
        }
    }

    DOCTEST_PRINTF_COLORED(getSeparator(), numFailed > 0 ? Color::Red : Color::Green);
    if(p->count || p->list_test_cases || p->list_test_suites) {
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("number of tests passing the current filters: %d\n", numTestsPassingFilters);
    } else {
        char buff[DOCTEST_SNPRINTF_BUFFER_LENGTH];

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "test cases: %4d", numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         numTestsPassingFilters - numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", numFailed);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d skipped\n",
                         static_cast<unsigned>(testArray.size()) - numTestsPassingFilters);
        DOCTEST_PRINTF_COLORED(buff, Color::None);

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "assertions: %4d", p->numAssertions);
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d passed",
                         p->numAssertions - p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, numFailed > 0 ? Color::None : Color::Green);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " | ");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), "%4d failed", p->numFailedAssertions);
        DOCTEST_PRINTF_COLORED(buff, p->numFailedAssertions > 0 ? Color::Red : Color::None);

        DOCTEST_SNPRINTF(buff, DOCTEST_COUNTOF(buff), " |\n");
        DOCTEST_PRINTF_COLORED(buff, Color::None);
    }

    // remove any coloring
    DOCTEST_PRINTF_COLORED("", Color::None);

    getContextState() = 0;

    if(numFailed && !p->no_exitcode)
        return EXIT_FAILURE;
    return EXIT_SUCCESS;
}